

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

void __thiscall ExecutorX86::ExecutorX86(ExecutorX86 *this,Linker *linker)

{
  char *pcVar1;
  Linker *linker_local;
  ExecutorX86 *this_local;
  
  this->exLinker = linker;
  this->exTypes = &linker->exTypes;
  this->exFunctions = &linker->exFunctions;
  this->exRegVmCode = &linker->exRegVmCode;
  this->exRegVmConstants = &linker->exRegVmConstants;
  this->exRegVmRegKillInfo = &linker->exRegVmRegKillInfo;
  FastVector<unsigned_int,_false,_false>::FastVector(&this->codeJumpTargets);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->codeRegKillInfoOffsets);
  CodeGenRegVmStateContext::CodeGenRegVmStateContext(&this->vmState);
  FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::FastVector(&this->expiredCodeBlocks);
  FastVector<x86Instruction,_true,_true>::FastVector(&this->instList);
  FastVector<unsigned_char_*,_false,_false>::FastVector(&this->instAddress);
  FastVector<unsigned_char_*,_false,_false>::FastVector(&this->functionAddress);
  FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::FastVector
            (&this->expiredFunctionAddressLists);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->globalCodeRanges);
  FastVector<_RUNTIME_FUNCTION,_false,_false>::FastVector(&this->functionWin64UnwindTable);
  FastVector<ExecutorX86::Breakpoint,_false,_false>::FastVector(&this->breakInstructions);
  this->codeGenCtx = (CodeGenRegVmContext *)0x0;
  pcVar1 = (char *)(*(code *)NULLC::alloc)(0x10000);
  this->execErrorBuffer = pcVar1;
  *this->execErrorBuffer = '\0';
  NULLC::fillMemory(this->execResult,0,0x200);
  this->codeRunning = false;
  this->minStackSize = 0x100000;
  this->lastFinalReturn = 0;
  this->callContinue = true;
  this->breakFunctionContext = (void *)0x0;
  this->breakFunction = (_func_uint_void_ptr_uint *)0x0;
  NULLC::fillMemory(this->codeLaunchHeader,0,0x1000);
  this->oldCodeLaunchHeaderProtect = 0;
  this->codeLaunchHeaderLength = 0;
  this->codeLaunchUnwindOffset = 0;
  this->codeLaunchDataLength = 0;
  this->codeLaunchWin64UnwindTable = (RUNTIME_FUNCTION *)0x0;
  this->binCode = (uchar *)0x0;
  this->binCodeSize = 0;
  this->binCodeReserved = 0;
  this->lastInstructionCount = 0;
  this->oldJumpTargetCount = 0;
  this->oldRegKillInfoCount = 0;
  this->oldFunctionSize = 0;
  this->oldCodeBodyProtect = 0;
  NULLC::currExecutor = this;
  return;
}

Assistant:

ExecutorX86::ExecutorX86(Linker *linker): exLinker(linker), exTypes(linker->exTypes), exFunctions(linker->exFunctions), exRegVmCode(linker->exRegVmCode), exRegVmConstants(linker->exRegVmConstants), exRegVmRegKillInfo(linker->exRegVmRegKillInfo)
{
	codeGenCtx = NULL;

	execErrorBuffer = (char*)NULLC::alloc(NULLC_ERROR_BUFFER_SIZE);
	*execErrorBuffer = 0;

	NULLC::fillMemory(execResult, 0, execResultSize);

	codeRunning = false;

	minStackSize = 1 * 1024 * 1024;

	lastFinalReturn = 0;

	callContinue = true;

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	dcCallVM = NULL;
#endif

	breakFunctionContext = NULL;
	breakFunction = NULL;

	NULLC::fillMemory(codeLaunchHeader, 0, codeLaunchHeaderSize);
	oldCodeLaunchHeaderProtect = 0;

	codeLaunchHeaderLength = 0;
	codeLaunchUnwindOffset = 0;
	codeLaunchDataLength = 0;
	codeLaunchWin64UnwindTable = NULL;

	binCode = NULL;
	binCodeSize = 0;
	binCodeReserved = 0;

	lastInstructionCount = 0;

	oldJumpTargetCount = 0;
	oldRegKillInfoCount = 0;
	oldFunctionSize = 0;
	oldCodeBodyProtect = 0;

	NULLC::currExecutor = this;
}